

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::trim_copy(string *__return_storage_ptr__,string *str)

{
  string *psVar1;
  undefined1 local_38 [8];
  string s;
  string *str_local;
  
  s.field_2._8_8_ = str;
  ::std::__cxx11::string::string((string *)local_38,(string *)str);
  psVar1 = trim((string *)local_38);
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  ::std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::string trim_copy(const std::string &str) {
    std::string s = str;
    return trim(s);
}